

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ap_str.c
# Opt level: O2

char * ap_str_trim_head_from_set(char *str,char *set)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  size_t sVar5;
  char *pcVar6;
  
  if (set != (char *)0x0 && str != (char *)0x0) {
    sVar1 = strlen(str);
    sVar2 = strlen(set);
    if (sVar2 != 0 && sVar1 != 0) {
      pcVar4 = str;
      for (sVar3 = 0; pcVar6 = str + sVar1, sVar3 != sVar1; sVar3 = sVar3 + 1) {
        sVar5 = 0;
        do {
          pcVar6 = pcVar4;
          if (sVar2 == sVar5) goto LAB_00104066;
          pcVar6 = set + sVar5;
          sVar5 = sVar5 + 1;
        } while (str[sVar3] != *pcVar6);
        pcVar4 = pcVar4 + 1;
      }
LAB_00104066:
      if (str < pcVar6) {
        sVar1 = strlen(pcVar6);
        pcVar4 = (char *)memmove(str,pcVar6,sVar1 + 1);
        return pcVar4;
      }
    }
  }
  return str;
}

Assistant:

char * ap_str_trim_head_from_set (char *str, const char *set)
{
	size_t			str_len;
	size_t			set_len;
	size_t			i;
	size_t			j;
	char			*p				= NULL;
	unsigned int	found			= 0;

	if (str == NULL || set == NULL)
	{
		goto finish;
	}

	str_len = strlen (str);
	set_len = strlen (set);

	if (str_len == 0 || set_len == 0)
	{
		goto finish;
	}

	p = str;

	for (i = 0; i < str_len; i ++)
	{
		found = 0;

		for (j = 0; j < set_len; j ++)
		{
			if (str[i] == set[j])
			{
				found = 1;
				p ++;

				break;
			}
		}

		if (found == 0)
		{
			break;
		}
	}

	if (p > str)
	{
		str_len = strlen (p);
		memmove (str, p, str_len + 1);
	}

finish:
	return str;
}